

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_FontList::CompareWeightStretchStyle(ON_Font **lhs,ON_Font **rhs)

{
  ON_Font *this;
  ON_Font *this_00;
  Style SVar1;
  Style SVar2;
  Stretch SVar3;
  Stretch SVar4;
  int iVar5;
  int iVar6;
  int rhs_font_weight;
  int lhs_font_weight;
  int rhs_font_stretch;
  int lhs_font_stretch;
  int rhs_font_style;
  int lhs_font_style;
  int rc;
  ON_Font *rhs_font;
  ON_Font *lhs_font;
  ON_Font **rhs_local;
  ON_Font **lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_Font **)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_Font **)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    this = *lhs;
    this_00 = *rhs;
    if (this == this_00) {
      lhs_local._4_4_ = 0;
    }
    else if (this == (ON_Font *)0x0) {
      lhs_local._4_4_ = 1;
    }
    else if (this_00 == (ON_Font *)0x0) {
      lhs_local._4_4_ = -1;
    }
    else {
      SVar1 = ON_Font::FontStyle(this);
      SVar2 = ON_Font::FontStyle(this_00);
      lhs_local._4_4_ = (uint)SVar1 - (uint)SVar2;
      if (lhs_local._4_4_ == 0) {
        SVar3 = ON_Font::FontStretch(this);
        SVar4 = ON_Font::FontStretch(this_00);
        lhs_local._4_4_ = (uint)SVar3 - (uint)SVar4;
        if (lhs_local._4_4_ == 0) {
          iVar5 = ON_Font::WindowsLogfontWeight(this);
          iVar6 = ON_Font::WindowsLogfontWeight(this_00);
          lhs_local._4_4_ = iVar5 - iVar6;
          if (lhs_local._4_4_ == 0) {
            lhs_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_FontList::CompareWeightStretchStyle(
  ON_Font const* const* lhs, 
  ON_Font const* const* rhs
  )
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);

  int rc;

  // Upright first, Italic 2nd, Oblique last

  // slope
  const int lhs_font_style = (int)static_cast<unsigned char>(lhs_font->FontStyle());
  const int rhs_font_style = (int)static_cast<unsigned char>(rhs_font->FontStyle());
  rc = (lhs_font_style - rhs_font_style);
  if (0 != rc)
    return rc;

  // width
  const int lhs_font_stretch = (int)static_cast<unsigned char>(lhs_font->FontStretch());
  const int rhs_font_stretch = (int)static_cast<unsigned char>(rhs_font->FontStretch());
  rc = (lhs_font_stretch - rhs_font_stretch);
  if (0 != rc)
    return rc;

  // weight
  const int lhs_font_weight = lhs_font->WindowsLogfontWeight();
  const int rhs_font_weight = rhs_font->WindowsLogfontWeight();
  rc = (lhs_font_weight - rhs_font_weight);
  if (0 != rc)
    return rc;

  return 0;
}